

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int rawWaveAddGeneric(uint numIn1,rawWave_t *in1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  uint in_EDI;
  bool bVar5;
  rawWave_t *out;
  rawWave_t *in2;
  uint32_t tDelay;
  uint32_t tNext2;
  uint32_t tNext1;
  uint32_t tNow;
  uint numOut;
  uint numIn2;
  uint cbs;
  uint level;
  uint outPos;
  uint inPos2;
  uint inPos1;
  uint32_t local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_4;
  
  iVar2 = wfcur;
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_20 = 0x416c;
  local_24 = 0;
  uVar1 = wfc[wfcur];
  iVar3 = 1 - wfcur;
  local_30 = 0;
  if (in_EDI == 0) {
    local_34 = 0xffffffff;
  }
  else {
    local_34 = 0;
  }
  if (uVar1 == 0) {
    local_38 = 0xffffffff;
  }
  else {
    local_38 = 0;
  }
  while( true ) {
    if ((local_14 < in_EDI) || (bVar5 = false, local_18 < uVar1)) {
      bVar5 = local_1c < 12000;
    }
    if (!bVar5) break;
    if (local_34 < local_38) {
      if (local_30 < local_34) {
        wf[iVar3][local_1c - 1].usDelay = (local_34 - local_30) + wf[iVar3][local_1c - 1].usDelay;
        local_30 = local_34;
      }
      wf[iVar3][local_1c].gpioOn = *(uint32_t *)(in_RSI + (ulong)local_14 * 0x10);
      wf[iVar3][local_1c].gpioOff = *(uint32_t *)(in_RSI + (ulong)local_14 * 0x10 + 4);
      wf[iVar3][local_1c].flags = *(uint32_t *)(in_RSI + (ulong)local_14 * 0x10 + 0xc);
      local_34 = local_30 + *(int *)(in_RSI + (ulong)local_14 * 0x10 + 8);
      local_14 = local_14 + 1;
    }
    else {
      if (local_38 < local_34) {
        if (local_30 < local_38) {
          wf[iVar3][local_1c - 1].usDelay = (local_38 - local_30) + wf[iVar3][local_1c - 1].usDelay;
          local_30 = local_38;
        }
        wf[iVar3][local_1c].gpioOn = wf[iVar2][local_18].gpioOn;
        wf[iVar3][local_1c].gpioOff = wf[iVar2][local_18].gpioOff;
        wf[iVar3][local_1c].flags = wf[iVar2][local_18].flags;
        local_38 = local_30 + wf[iVar2][local_18].usDelay;
      }
      else {
        if (local_30 < local_34) {
          wf[iVar3][local_1c - 1].usDelay = (local_34 - local_30) + wf[iVar3][local_1c - 1].usDelay;
          local_30 = local_34;
        }
        wf[iVar3][local_1c].gpioOn =
             *(uint *)(in_RSI + (ulong)local_14 * 0x10) | wf[iVar2][local_18].gpioOn;
        wf[iVar3][local_1c].gpioOff =
             *(uint *)(in_RSI + (ulong)local_14 * 0x10 + 4) | wf[iVar2][local_18].gpioOff;
        wf[iVar3][local_1c].flags =
             *(uint *)(in_RSI + (ulong)local_14 * 0x10 + 0xc) | wf[iVar2][local_18].flags;
        local_34 = local_30 + *(int *)(in_RSI + (ulong)local_14 * 0x10 + 8);
        local_14 = local_14 + 1;
        local_38 = local_30 + wf[iVar2][local_18].usDelay;
      }
      local_18 = local_18 + 1;
    }
    if (local_38 < local_34) {
      local_3c = local_38 - local_30;
      local_30 = local_38;
    }
    else {
      local_3c = local_34 - local_30;
      local_30 = local_34;
    }
    wf[iVar3][local_1c].usDelay = local_3c;
    iVar4 = waveDelayCBs(local_3c);
    local_24 = iVar4 + local_24;
    if (wf[iVar3][local_1c].gpioOn != 0) {
      local_24 = local_24 + 1;
    }
    if (wf[iVar3][local_1c].gpioOff != 0) {
      local_24 = local_24 + 1;
    }
    if ((wf[iVar3][local_1c].flags & 1) != 0) {
      local_24 = local_24 + 1;
      local_20 = local_20 - 1;
    }
    if ((wf[iVar3][local_1c].flags & 2) != 0) {
      local_24 = local_24 + 1;
      local_20 = local_20 - 1;
    }
    local_1c = local_1c + 1;
    if (in_EDI <= local_14) {
      local_34 = 0xffffffff;
    }
    if (uVar1 <= local_18) {
      local_38 = 0xffffffff;
    }
  }
  if ((local_1c < 12000) && (local_1c < local_20)) {
    wfStats.micros = local_30;
    if (wfStats.highMicros < local_30) {
      wfStats.highMicros = local_30;
    }
    wfStats.pulses = local_1c;
    if (wfStats.highPulses < local_1c) {
      wfStats.highPulses = local_1c;
    }
    wfStats.cbs = local_24;
    if (wfStats.highCbs < local_24) {
      wfStats.highCbs = local_24;
    }
    wfc[1 - wfcur] = local_1c;
    wfcur = 1 - wfcur;
    local_4 = local_1c;
  }
  else {
    local_4 = 0xffffffdc;
  }
  return local_4;
}

Assistant:

int rawWaveAddGeneric(unsigned numIn1, rawWave_t *in1)
{
   unsigned inPos1=0, inPos2=0, outPos=0, level = NUM_WAVE_OOL;

   unsigned cbs=0;

   unsigned numIn2, numOut;

   uint32_t tNow, tNext1, tNext2, tDelay;

   rawWave_t *in2, *out;

   numIn2 = wfc[wfcur];
   in2    = wf[wfcur];

   numOut = PI_WAVE_MAX_PULSES;
   out   = wf[1-wfcur];

   tNow = 0;

   if (!numIn1) tNext1 = -1; else tNext1 = 0;
   if (!numIn2) tNext2 = -1; else tNext2 = 0;

   while (((inPos1<numIn1) || (inPos2<numIn2)) && (outPos<numOut))
   {
      if (tNext1 < tNext2)
      {
         /* pulse 1 due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff;
         out[outPos].flags   = in1[inPos1].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
      }
      else if (tNext2 < tNext1)
      {
         /* pulse 2 due */

         if (tNow < tNext2)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext2 - tNow);
            tNow = tNext2;
         }

         out[outPos].gpioOn  = in2[inPos2].gpioOn;
         out[outPos].gpioOff = in2[inPos2].gpioOff;
         out[outPos].flags   = in2[inPos2].flags;

         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }
      else
      {
         /* pulse 1 and 2 both due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn  | in2[inPos2].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff | in2[inPos2].gpioOff;
         out[outPos].flags   = in1[inPos1].flags   | in2[inPos2].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }

      if (tNext1 <= tNext2) { tDelay = tNext1 - tNow; tNow = tNext1; }
      else                  { tDelay = tNext2 - tNow; tNow = tNext2; }

      out[outPos].usDelay = tDelay;

      cbs += waveDelayCBs(tDelay);

      if (out[outPos].gpioOn) cbs++; /* one cb if gpio on */

      if (out[outPos].gpioOff) cbs++; /* one cb if gpio off */

      if (out[outPos].flags & WAVE_FLAG_READ)
      {
         cbs++; /* one cb if read */
         --level;
      }

      if (out[outPos].flags & WAVE_FLAG_TICK)
      {
         cbs++; /* one cb if tick */
         --level;
      }

      outPos++;

      if (inPos1 >= numIn1) tNext1 = -1;
      if (inPos2 >= numIn2) tNext2 = -1;

   }

   if ((outPos < numOut) && (outPos < level))
   {
      wfStats.micros = tNow;

      if (tNow > wfStats.highMicros) wfStats.highMicros = tNow;

      wfStats.pulses = outPos;

      if (outPos > wfStats.highPulses) wfStats.highPulses = outPos;

      wfStats.cbs    = cbs;

      if (cbs > wfStats.highCbs) wfStats.highCbs = cbs;

      wfc[1-wfcur] = outPos;
      wfcur = 1 - wfcur;

      return outPos;
   }
   else return PI_TOO_MANY_PULSES;
}